

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O2

Client * __thiscall
kj::Function<capnproto_test::capnp::test::TestMembrane::Thing::Client_()>::
Impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/membrane-test.c++:306:17)>
::operator()(Client *__return_storage_ptr__,
            Impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_membrane_test_c__:306:17)>
            *this)

{
  size_t in_RCX;
  void *__buf;
  int in_R8D;
  Request<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
  local_e0;
  Reader local_a8;
  Own<capnp::ResponseHook> local_78;
  Request<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
  local_68;
  Maybe<capnp::MessageSize> local_30;
  
  local_30.ptr.isSet = false;
  capnproto_test::capnp::test::TestMembrane::Client::makeThingRequest
            (&local_68,&((this->f).env)->membraned,&local_30);
  capnp::
  Request<capnproto_test::capnp::test::TestMembrane::MakeThingParams,_capnproto_test::capnp::test::TestMembrane::MakeThingResults>
  ::send(&local_e0,(int)&local_68,__buf,in_RCX,in_R8D);
  Promise<capnp::Response<capnproto_test::capnp::test::TestMembrane::MakeThingResults>_>::wait
            ((Promise<capnp::Response<capnproto_test::capnp::test::TestMembrane::MakeThingResults>_>
              *)&local_a8,&local_e0);
  capnproto_test::capnp::test::TestMembrane::MakeThingResults::Reader::getThing
            (__return_storage_ptr__,&local_a8);
  Own<capnp::ResponseHook>::dispose(&local_78);
  capnp::RemotePromise<capnproto_test::capnp::test::TestMembrane::MakeThingResults>::~RemotePromise
            ((RemotePromise<capnproto_test::capnp::test::TestMembrane::MakeThingResults> *)&local_e0
            );
  Own<capnp::RequestHook>::dispose(&local_68.hook);
  return __return_storage_ptr__;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }